

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int big2_scanPercent(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  
  if (ptr == end) {
    return -1;
  }
  bVar2 = *ptr;
  if (bVar2 - 0xd8 < 4) {
switchD_0047ae17_caseD_7:
    lVar5 = (long)end - (long)ptr;
joined_r0x0047ae39:
    pbVar1 = (byte *)ptr;
    if (lVar5 < 4) {
      return -2;
    }
  }
  else {
    pbVar1 = (byte *)ptr;
    if (3 < bVar2 - 0xdc) {
      if (bVar2 == 0) {
        cVar3 = *(char *)((long)enc[1].scanners + (ulong)(byte)ptr[1]);
        iVar4 = 0x16;
        switch(cVar3) {
        case '\x05':
          lVar5 = (long)end - (long)ptr;
joined_r0x0047ae7f:
          pbVar1 = (byte *)ptr;
          if (lVar5 < 2) {
            return -2;
          }
          break;
        case '\x06':
          lVar5 = (long)end - (long)ptr;
joined_r0x0047ae6c:
          pbVar1 = (byte *)ptr;
          if (lVar5 < 3) {
            return -2;
          }
          break;
        case '\a':
          goto switchD_0047ae17_caseD_7;
        case '\b':
        case '\v':
        case '\f':
        case '\r':
        case '\x0e':
        case '\x0f':
        case '\x10':
        case '\x11':
        case '\x12':
        case '\x13':
        case '\x14':
        case '\x17':
          break;
        case '\t':
        case '\n':
        case '\x15':
          goto switchD_0047ae17_caseD_9;
        case '\x16':
        case '\x18':
          goto switchD_0047ae17_caseD_16;
        default:
          if (cVar3 == '\x1e') goto switchD_0047ae17_caseD_9;
          if (cVar3 == '\x1d') goto LAB_0047ace5;
        }
      }
      else if ((bVar2 != 0xff) || ((byte)ptr[1] < 0xfe)) {
LAB_0047ace5:
        if ((*(uint *)((long)namingBitmap +
                      (ulong)((byte)ptr[1] >> 3 & 0x1c |
                             (uint)"\x02\x03\x04\x05\x06\a\b"[bVar2] << 5)) >> ((byte)ptr[1] & 0x1f)
            & 1) != 0) {
switchD_0047ae17_caseD_16:
          lVar5 = (long)end - (long)ptr;
          ptr = ptr + 4;
          while( true ) {
            lVar5 = lVar5 + -2;
            pbVar1 = (byte *)ptr + -2;
            if (pbVar1 == (byte *)end) {
              return -1;
            }
            bVar2 = *pbVar1;
            if (bVar2 == 0) break;
            if (bVar2 == 0xff) {
              if (0xfd < ((byte *)ptr)[-1]) goto switchD_0047addb_caseD_8;
            }
            else {
              if (bVar2 - 0xd8 < 4) goto switchD_0047addb_caseD_7;
              if (bVar2 - 0xdc < 4) goto switchD_0047addb_caseD_8;
            }
switchD_0047addb_caseD_1d:
            if ((*(uint *)((long)namingBitmap +
                          (ulong)(((byte *)ptr)[-1] >> 3 & 0x1c |
                                 (uint)"\x19\x03\x1a\x1b\x1c\x1d\x1e"[bVar2] << 5)) >>
                 (((byte *)ptr)[-1] & 0x1f) & 1) == 0) goto switchD_0047addb_caseD_8;
switchD_0047addb_caseD_16:
            ptr = (char *)((byte *)ptr + 2);
          }
          switch(*(undefined1 *)((long)enc[1].scanners + (ulong)((byte *)ptr)[-1])) {
          case 5:
            ptr = (char *)pbVar1;
            goto joined_r0x0047ae7f;
          case 6:
            ptr = (char *)pbVar1;
            goto joined_r0x0047ae6c;
          case 7:
switchD_0047addb_caseD_7:
            ptr = (char *)pbVar1;
            goto joined_r0x0047ae39;
          default:
            break;
          case 0x12:
            iVar4 = 0x1c;
            goto switchD_0047ae17_caseD_9;
          case 0x16:
          case 0x18:
          case 0x19:
          case 0x1a:
          case 0x1b:
            goto switchD_0047addb_caseD_16;
          case 0x1d:
            goto switchD_0047addb_caseD_1d;
          }
        }
      }
    }
  }
switchD_0047addb_caseD_8:
  ptr = (char *)pbVar1;
  iVar4 = 0;
switchD_0047ae17_caseD_9:
  *nextTokPtr = ptr;
  return iVar4;
}

Assistant:

static
int PREFIX(scanPercent)(const ENCODING *enc, const char *ptr, const char *end,
                        const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_PARTIAL;
  switch (BYTE_TYPE(enc, ptr)) {
  CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_S: case BT_LF: case BT_CR: case BT_PERCNT:
    *nextTokPtr = ptr;
    return XML_TOK_PERCENT;
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_PARAM_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}